

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md32_common.h
# Opt level: O3

bcm_infallible BCM_sha1_update(SHA_CTX *c,void *data,size_t len)

{
  uint32_t *puVar1;
  uint8_t *data_00;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  size_t __n;
  
  if (len != 0) {
    uVar3 = (int)len * 8;
    puVar1 = &c->Nl;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar3;
    c->Nh = c->Nh + (int)(len >> 0x1d) + (uint)CARRY4(uVar2,uVar3);
    data_00 = c->data;
    uVar4 = (ulong)c->num;
    if (uVar4 != 0) {
      if (uVar4 + len < 0x40 && len < 0x40) {
        memcpy(data_00 + uVar4,data,len);
        c->num = c->num + (int)len;
        return approved;
      }
      __n = -(uVar4 - 0x40);
      if (uVar4 != 0x40) {
        memcpy(data_00 + uVar4,data,__n);
      }
      sha1_block_data_order(c->h,data_00,1);
      data = (void *)((long)data + __n);
      len = len + (uVar4 - 0x40);
      c->data[0x30] = '\0';
      c->data[0x31] = '\0';
      c->data[0x32] = '\0';
      c->data[0x33] = '\0';
      c->data[0x34] = '\0';
      c->data[0x35] = '\0';
      c->data[0x36] = '\0';
      c->data[0x37] = '\0';
      c->data[0x38] = '\0';
      c->data[0x39] = '\0';
      c->data[0x3a] = '\0';
      c->data[0x3b] = '\0';
      c->data[0x3c] = '\0';
      c->data[0x3d] = '\0';
      c->data[0x3e] = '\0';
      c->data[0x3f] = '\0';
      c->data[0x20] = '\0';
      c->data[0x21] = '\0';
      c->data[0x22] = '\0';
      c->data[0x23] = '\0';
      c->data[0x24] = '\0';
      c->data[0x25] = '\0';
      c->data[0x26] = '\0';
      c->data[0x27] = '\0';
      c->data[0x28] = '\0';
      c->data[0x29] = '\0';
      c->data[0x2a] = '\0';
      c->data[0x2b] = '\0';
      c->data[0x2c] = '\0';
      c->data[0x2d] = '\0';
      c->data[0x2e] = '\0';
      c->data[0x2f] = '\0';
      c->data[0x10] = '\0';
      c->data[0x11] = '\0';
      c->data[0x12] = '\0';
      c->data[0x13] = '\0';
      c->data[0x14] = '\0';
      c->data[0x15] = '\0';
      c->data[0x16] = '\0';
      c->data[0x17] = '\0';
      c->data[0x18] = '\0';
      c->data[0x19] = '\0';
      c->data[0x1a] = '\0';
      c->data[0x1b] = '\0';
      c->data[0x1c] = '\0';
      c->data[0x1d] = '\0';
      c->data[0x1e] = '\0';
      c->data[0x1f] = '\0';
      data_00[0] = '\0';
      data_00[1] = '\0';
      data_00[2] = '\0';
      data_00[3] = '\0';
      data_00[4] = '\0';
      data_00[5] = '\0';
      data_00[6] = '\0';
      data_00[7] = '\0';
      c->data[8] = '\0';
      c->data[9] = '\0';
      c->data[10] = '\0';
      c->data[0xb] = '\0';
      c->data[0xc] = '\0';
      c->data[0xd] = '\0';
      c->data[0xe] = '\0';
      c->data[0xf] = '\0';
      c->num = 0;
    }
    if (0x3f < len) {
      sha1_block_data_order(c->h,(uint8_t *)data,len >> 6);
      data = (void *)((long)data + (len & 0xffffffffffffffc0));
      len = (size_t)((uint)len & 0x3f);
    }
    if (len != 0) {
      c->num = (uint)len;
      memcpy(data_00,data,len);
    }
  }
  return approved;
}

Assistant:

static inline void crypto_md32_update(crypto_md32_block_func block_func,
                                      uint32_t *h, uint8_t *data,
                                      size_t block_size, unsigned *num,
                                      uint32_t *Nh, uint32_t *Nl,
                                      const uint8_t *in, size_t len) {
  if (len == 0) {
    return;
  }

  uint32_t l = *Nl + (((uint32_t)len) << 3);
  if (l < *Nl) {
    // Handle carries.
    (*Nh)++;
  }
  *Nh += (uint32_t)(len >> 29);
  *Nl = l;

  size_t n = *num;
  if (n != 0) {
    if (len >= block_size || len + n >= block_size) {
      OPENSSL_memcpy(data + n, in, block_size - n);
      block_func(h, data, 1);
      n = block_size - n;
      in += n;
      len -= n;
      *num = 0;
      // Keep |data| zeroed when unused.
      OPENSSL_memset(data, 0, block_size);
    } else {
      OPENSSL_memcpy(data + n, in, len);
      *num += (unsigned)len;
      return;
    }
  }

  n = len / block_size;
  if (n > 0) {
    block_func(h, in, n);
    n *= block_size;
    in += n;
    len -= n;
  }

  if (len != 0) {
    *num = (unsigned)len;
    OPENSSL_memcpy(data, in, len);
  }
}